

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpIntZext::TypeOpIntZext(TypeOpIntZext *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"ZEXT",&local_31);
  TypeOpFunc::TypeOpFunc(&this->super_TypeOpFunc,t,CPUI_INT_ZEXT,&local_30,TYPE_UINT,TYPE_UINT);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f2bb0;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x8000;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_INT_ZEXT;
  pOVar1->isunary = true;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fe358;
  (this->super_TypeOpFunc).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpIntZext::TypeOpIntZext(TypeFactory *t)
  : TypeOpFunc(t,CPUI_INT_ZEXT,"ZEXT",TYPE_UINT,TYPE_UINT)
{
  opflags = PcodeOp::unary;
  behave = new OpBehaviorIntZext();
}